

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O3

void Gia_ManObjSimAnd(Gia_Man_t *p,int iObj)

{
  uint uVar1;
  uint uVar2;
  word *pwVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar1 = p->nSimWords;
  uVar4 = (ulong)uVar1;
  uVar5 = uVar1 * iObj;
  if (-1 < (int)uVar5) {
    uVar2 = p->vSims->nSize;
    if ((int)uVar5 < (int)uVar2) {
      uVar7 = *(ulong *)(p->pObjs + (uint)iObj);
      uVar8 = (iObj - ((uint)uVar7 & 0x1fffffff)) * uVar1;
      if ((((-1 < (int)uVar8) && (uVar8 < uVar2)) &&
          (uVar6 = (iObj - ((uint)(uVar7 >> 0x20) & 0x1fffffff)) * uVar1, -1 < (int)uVar6)) &&
         (uVar6 < uVar2)) {
        pwVar3 = p->vSims->pArray;
        if (((uint)uVar7 >> 0x1d & 1) == 0) {
          if ((uVar7 >> 0x3d & 1) == 0) {
            if (0 < (int)uVar1) {
              uVar7 = 0;
              do {
                pwVar3[uVar5 + uVar7] = pwVar3[uVar6 + uVar7] & pwVar3[uVar8 + uVar7];
                uVar7 = uVar7 + 1;
              } while (uVar4 != uVar7);
            }
          }
          else if (0 < (int)uVar1) {
            uVar7 = 0;
            do {
              pwVar3[uVar5 + uVar7] = ~pwVar3[uVar6 + uVar7] & pwVar3[uVar8 + uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar4 != uVar7);
          }
        }
        else if ((uVar7 >> 0x3d & 1) == 0) {
          if (0 < (int)uVar1) {
            uVar7 = 0;
            do {
              pwVar3[uVar5 + uVar7] = ~pwVar3[uVar8 + uVar7] & pwVar3[uVar6 + uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar4 != uVar7);
          }
        }
        else if (0 < (int)uVar1) {
          uVar7 = 0;
          do {
            pwVar3[uVar5 + uVar7] = ~(pwVar3[uVar6 + uVar7] | pwVar3[uVar8 + uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

static inline void Gia_ManObjSimAnd( Gia_Man_t * p, int iObj )
{
    int w;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    word * pSim  = Gia_ManObjSim( p, iObj );
    word * pSim0 = Gia_ManObjSim( p, Gia_ObjFaninId0(pObj, iObj) );
    word * pSim1 = Gia_ManObjSim( p, Gia_ObjFaninId1(pObj, iObj) );
    if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = ~pSim0[w] & ~pSim1[w];
    else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = ~pSim0[w] & pSim1[w];
    else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = pSim0[w] & ~pSim1[w];
    else
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = pSim0[w] & pSim1[w];
}